

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::initialize
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  undefined4 uVar1;
  value_type *in_RDI;
  size_type in_stack_00000018;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *in_stack_00000020;
  uint in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::reserve
            (in_stack_00000020,in_stack_00000018);
  uVar2 = 0;
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::push_back
            ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
             (ulong)in_stack_fffffffffffffff0,in_RDI);
  uVar1 = 2;
  if (*(undefined8 *)(in_RDI + 0x12) != initial) {
    uVar1 = 1;
  }
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::push_back
            ((vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *)
             CONCAT44(uVar2,uVar1),in_RDI);
  return;
}

Assistant:

void initialize()
    {
        stack_.reserve(default_depth);
        stack_.push_back(csv_mode::initial);
        stack_.push_back((header_lines_ > 0) ? csv_mode::header : csv_mode::data);
    }